

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O1

png_uint_32 get_unknown(display *d,png_infop info_ptr,int after_IDAT)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  long in_RAX;
  long lVar4;
  anon_struct_32_7_46fe1f00 *paVar5;
  png_uint_32 pVar6;
  char *pcVar7;
  byte *pbVar8;
  ulong uVar9;
  png_unknown_chunkp unknown;
  long local_38;
  
  local_38 = in_RAX;
  uVar3 = png_get_unknown_chunks(d->png_ptr,info_ptr,&local_38);
  if ((int)uVar3 < 1) {
    pVar6 = 0;
  }
  else {
    pVar6 = 0;
    uVar9 = (ulong)uVar3;
    do {
      pbVar8 = (byte *)((uVar9 - 1) * 0x20 + local_38);
      lVar4 = -0x19;
      paVar5 = chunk_info + 0x18;
      do {
        if (lVar4 == 0) {
          uVar3 = 0xffffffff;
          goto LAB_001033c6;
        }
        pcVar7 = paVar5->name;
        lVar4 = lVar4 + 1;
        paVar5 = paVar5 + -1;
      } while (*(int *)pcVar7 != *(int *)pbVar8);
      uVar3 = -(int)lVar4;
LAB_001033c6:
      if ((int)uVar3 < 0) {
        iVar1 = d->keep;
        if (iVar1 == 2) {
          if ((*pbVar8 & 0x20) == 0) {
            fprintf(_stderr,"%s(%s): if-safe: %s: unknown critical chunk saved\n",d->file,d->test,
                    pbVar8);
            goto LAB_00103450;
          }
        }
        else if (iVar1 != 3) {
          pcVar7 = "discard";
          if (iVar1 == 0) {
            pcVar7 = "default";
          }
          fprintf(_stderr,"%s(%s): %s: %s: unknown chunk saved\n",d->file,d->test,pcVar7);
LAB_00103450:
          d->error_count = d->error_count + 1;
        }
      }
      else {
        pVar6 = pVar6 | chunk_info[uVar3].flag;
      }
      bVar2 = 1 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar2);
  }
  return pVar6;
}

Assistant:

static png_uint_32
get_unknown(display *d, png_infop info_ptr, int after_IDAT)
{
   /* Create corresponding 'unknown' flags */
   png_uint_32 flags = 0;

   UNUSED(after_IDAT)

   {
      png_unknown_chunkp unknown;
      int num_unknown = png_get_unknown_chunks(d->png_ptr, info_ptr, &unknown);

      while (--num_unknown >= 0)
      {
         int chunk = findb(unknown[num_unknown].name);

         /* Chunks not known to pngunknown must be validated here; since they
          * must also be unknown to libpng the 'display->keep' behavior should
          * have been used.
          */
         if (chunk < 0) switch (d->keep)
         {
            default: /* impossible */
            case PNG_HANDLE_CHUNK_AS_DEFAULT:
            case PNG_HANDLE_CHUNK_NEVER:
               fprintf(stderr, "%s(%s): %s: %s: unknown chunk saved\n",
                  d->file, d->test, d->keep ? "discard" : "default",
                  unknown[num_unknown].name);
               ++(d->error_count);
               break;

            case PNG_HANDLE_CHUNK_IF_SAFE:
               if (!ancillaryb(unknown[num_unknown].name))
               {
                  fprintf(stderr,
                     "%s(%s): if-safe: %s: unknown critical chunk saved\n",
                     d->file, d->test, unknown[num_unknown].name);
                  ++(d->error_count);
                  break;
               }
               /* FALLTHROUGH */ /* (safe) */
            case PNG_HANDLE_CHUNK_ALWAYS:
               break;
         }

         else
            flags |= chunk_info[chunk].flag;
      }
   }

   return flags;
}